

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetDropCount
          (BinaryReaderInterp *this,Index keep_count,size_t type_stack_limit,Index *out_drop_count)

{
  uint uVar1;
  size_t sVar2;
  Index local_44;
  Index type_stack_count;
  Index *out_drop_count_local;
  size_t type_stack_limit_local;
  Index keep_count_local;
  BinaryReaderInterp *this_local;
  
  sVar2 = SharedValidator::type_stack_size(&this->validator_);
  if (type_stack_limit <= sVar2) {
    sVar2 = SharedValidator::type_stack_size(&this->validator_);
    uVar1 = (int)sVar2 - (int)type_stack_limit;
    if (uVar1 < keep_count) {
      local_44 = 0;
    }
    else {
      local_44 = uVar1 - keep_count;
    }
    *out_drop_count = local_44;
    Result::Result((Result *)((long)&this_local + 4),Ok);
    return (Result)this_local._4_4_;
  }
  __assert_fail("validator_.type_stack_size() >= type_stack_limit",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                ,0x1a1,
                "Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetDropCount(Index, size_t, Index *)"
               );
}

Assistant:

Result BinaryReaderInterp::GetDropCount(Index keep_count,
                                        size_t type_stack_limit,
                                        Index* out_drop_count) {
  assert(validator_.type_stack_size() >= type_stack_limit);
  Index type_stack_count = validator_.type_stack_size() - type_stack_limit;
  // The keep_count may be larger than the type_stack_count if the typechecker
  // is currently unreachable. In that case, it doesn't matter what value we
  // drop, but 0 is a reasonable choice.
  *out_drop_count =
      type_stack_count >= keep_count ? type_stack_count - keep_count : 0;
  return Result::Ok;
}